

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageFlipVertical(Image *image)

{
  void *__ptr;
  int iVar1;
  void *pvVar2;
  int iVar3;
  void *__dest;
  ulong uVar4;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    iVar1 = GetPixelDataSize(1,1,image->format);
    iVar1 = iVar1 * image->width;
    iVar3 = image->height;
    pvVar2 = malloc((long)(iVar1 * iVar3));
    __ptr = image->data;
    if (0 < (long)iVar3) {
      uVar4 = (long)iVar3 + 1;
      iVar3 = (iVar3 + -1) * iVar1;
      __dest = pvVar2;
      do {
        memcpy(__dest,(void *)((long)__ptr + (long)iVar3),(long)iVar1);
        uVar4 = uVar4 - 1;
        iVar3 = iVar3 - iVar1;
        __dest = (void *)((long)__dest + (long)iVar1);
      } while (1 < uVar4);
    }
    free(__ptr);
    image->data = pvVar2;
  }
  return;
}

Assistant:

void ImageFlipVertical(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *flippedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int i = (image->height - 1), offsetSize = 0; i >= 0; i--)
        {
            memcpy(flippedData + offsetSize, ((unsigned char *)image->data) + i*image->width*bytesPerPixel, image->width*bytesPerPixel);
            offsetSize += image->width*bytesPerPixel;
        }

        RL_FREE(image->data);
        image->data = flippedData;
    }
}